

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdpostct.c
# Opt level: O0

void jinit_d_post_controller(j_decompress_ptr cinfo,boolean need_full_buffer)

{
  JDIMENSION JVar1;
  int iVar2;
  _func_jvirt_sarray_ptr_j_common_ptr_int_boolean_JDIMENSION_JDIMENSION_JDIMENSION *p_Var3;
  jpeg_d_post_controller *pjVar4;
  long lVar5;
  jvirt_sarray_ptr pjVar6;
  JSAMPARRAY ppJVar7;
  my_post_ptr post;
  boolean need_full_buffer_local;
  j_decompress_ptr cinfo_local;
  
  pjVar4 = (jpeg_d_post_controller *)(*cinfo->mem->alloc_small)((j_common_ptr)cinfo,1,0x30);
  cinfo->post = pjVar4;
  pjVar4->start_pass = start_pass_dpost;
  pjVar4[1].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)0x0;
  pjVar4[1].post_process_data =
       (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
        *)0x0;
  if (cinfo->quantize_colors != 0) {
    *(int *)&pjVar4[2].start_pass = cinfo->max_v_samp_factor;
    if (need_full_buffer == 0) {
      ppJVar7 = (*cinfo->mem->alloc_sarray)
                          ((j_common_ptr)cinfo,1,cinfo->output_width * cinfo->out_color_components,
                           *(JDIMENSION *)&pjVar4[2].start_pass);
      pjVar4[1].post_process_data =
           (_func_void_j_decompress_ptr_JSAMPIMAGE_JDIMENSION_ptr_JDIMENSION_JSAMPARRAY_JDIMENSION_ptr_JDIMENSION
            *)ppJVar7;
    }
    else {
      p_Var3 = cinfo->mem->request_virt_sarray;
      JVar1 = cinfo->output_width;
      iVar2 = cinfo->out_color_components;
      lVar5 = jround_up((ulong)cinfo->output_height,(ulong)*(uint *)&pjVar4[2].start_pass);
      pjVar6 = (*p_Var3)((j_common_ptr)cinfo,1,0,JVar1 * iVar2,(JDIMENSION)lVar5,
                         *(JDIMENSION *)&pjVar4[2].start_pass);
      pjVar4[1].start_pass = (_func_void_j_decompress_ptr_J_BUF_MODE *)pjVar6;
    }
  }
  return;
}

Assistant:

GLOBAL(void)
jinit_d_post_controller (j_decompress_ptr cinfo, boolean need_full_buffer)
{
  my_post_ptr post;

  post = (my_post_ptr)
    (*cinfo->mem->alloc_small) ((j_common_ptr) cinfo, JPOOL_IMAGE,
				SIZEOF(my_post_controller));
  cinfo->post = (struct jpeg_d_post_controller *) post;
  post->pub.start_pass = start_pass_dpost;
  post->whole_image = NULL;	/* flag for no virtual arrays */
  post->buffer = NULL;		/* flag for no strip buffer */

  /* Create the quantization buffer, if needed */
  if (cinfo->quantize_colors) {
    /* The buffer strip height is max_v_samp_factor, which is typically
     * an efficient number of rows for upsampling to return.
     * (In the presence of output rescaling, we might want to be smarter?)
     */
    post->strip_height = (JDIMENSION) cinfo->max_v_samp_factor;
    if (need_full_buffer) {
      /* Two-pass color quantization: need full-image storage. */
      /* We round up the number of rows to a multiple of the strip height. */
#ifdef QUANT_2PASS_SUPPORTED
      post->whole_image = (*cinfo->mem->request_virt_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE, FALSE,
	 cinfo->output_width * cinfo->out_color_components,
	 (JDIMENSION) jround_up((long) cinfo->output_height,
				(long) post->strip_height),
	 post->strip_height);
#else
      ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);
#endif /* QUANT_2PASS_SUPPORTED */
    } else {
      /* One-pass color quantization: just make a strip buffer. */
      post->buffer = (*cinfo->mem->alloc_sarray)
	((j_common_ptr) cinfo, JPOOL_IMAGE,
	 cinfo->output_width * cinfo->out_color_components,
	 post->strip_height);
    }
  }
}